

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_erase_single_element_Test::VectorSUnitTest_erase_single_element_Test
          (VectorSUnitTest_erase_single_element_Test *this)

{
  VectorSUnitTest_erase_single_element_Test *this_local;
  
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorSUnitTest_erase_single_element_Test_001d1148;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, erase_single_element)
{
    vector_s<unsigned, 12> v{0u, 1u, 2u, 3u, 4u, 5u};
    EXPECT_EQ(6u, v.size());

    // Erase one element from the beginning
    const auto it1 = v.erase(v.begin());
    EXPECT_EQ(1u, *it1);
    EXPECT_EQ(v.begin(), it1);
    EXPECT_EQ(5u, v.size());
    EXPECT_EQ(1u, v[0]);
    EXPECT_EQ(2u, v[1]);
    EXPECT_EQ(3u, v[2]);
    EXPECT_EQ(4u, v[3]);
    EXPECT_EQ(5u, v[4]);

    // Erase one element from the middle
    const auto it2 = v.erase(v.begin()+2);
    EXPECT_EQ(4u, *it2);
    EXPECT_EQ(v.begin()+2, it2);
    EXPECT_EQ(4u, v.size());
    EXPECT_EQ(1u, v[0]);
    EXPECT_EQ(2u, v[1]);
    EXPECT_EQ(4u, v[2]);
    EXPECT_EQ(5u, v[3]);

    // Erase last element
    const auto it3 = v.erase(v.end()-1);
    EXPECT_EQ(v.end(), it3);
    EXPECT_EQ(3u, v.size());
    EXPECT_EQ(1u, v[0]);
    EXPECT_EQ(2u, v[1]);
    EXPECT_EQ(4u, v[2]);
}